

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O0

void __thiscall mocker::Annotator::operator()(Annotator *this,ContinueStmt *node)

{
  unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
  *this_00;
  PosPair PVar1;
  ContinueOutOfALoop *this_01;
  mapped_type *pmVar2;
  NodeID local_40;
  size_t local_38;
  size_t sStack_30;
  size_t local_28;
  size_t sStack_20;
  ASTNode *local_18;
  ContinueStmt *node_local;
  Annotator *this_local;
  
  if ((this->inLoop & 1U) == 0) {
    local_18 = (ASTNode *)node;
    node_local = (ContinueStmt *)this;
    this_01 = (ContinueOutOfALoop *)__cxa_allocate_exception(0x48);
    this_00 = this->pos;
    local_40 = ast::ASTNode::getID(local_18);
    pmVar2 = std::
             unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
             ::at(this_00,&local_40);
    local_38 = (pmVar2->first).line;
    sStack_30 = (pmVar2->first).col;
    local_28 = (pmVar2->second).line;
    sStack_20 = (pmVar2->second).col;
    PVar1.first = pmVar2->first;
    PVar1.second = pmVar2->second;
    ContinueOutOfALoop::CompileError(this_01,PVar1);
    __cxa_throw(this_01,&ContinueOutOfALoop::typeinfo,ContinueOutOfALoop::~ContinueOutOfALoop);
  }
  return;
}

Assistant:

void operator()(ast::ContinueStmt &node) const override {
    if (!inLoop)
      throw ContinueOutOfALoop(pos.at(node.getID()));
  }